

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<double>::make_l1_norm(default_cost_type<double> *this,int n)

{
  double *pdVar1;
  int i;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  pdVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  dVar3 = 0.0;
  uVar2 = 0;
  while ((uint)n != uVar2) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pdVar1[uVar2];
    uVar2 = uVar2 + 1;
    auVar5 = vandpd_avx(auVar5,auVar4);
    dVar3 = dVar3 + auVar5._0_8_;
  }
  if ((uint)((long)ABS(dVar3) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    for (uVar2 = 0; (uint)n != uVar2; uVar2 = uVar2 + 1) {
      pdVar1[uVar2] = pdVar1[uVar2] / dVar3;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }